

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

bool __thiscall
QDockAreaLayout::restoreState
          (QDockAreaLayout *this,QDataStream *stream,QList<QDockWidget_*> *_dockwidgets,bool testing
          )

{
  bool bVar1;
  Status SVar2;
  long lVar3;
  undefined1 in_CL;
  QDataStream *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  byte bVar4;
  int i_2;
  int i_1;
  bool ok;
  int i;
  QSize size;
  QSize size_1;
  int pos;
  int cnt;
  QList<QDockWidget_*> dockwidgets;
  int cornerData [4];
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar5;
  undefined3 in_stack_ffffffffffffff64;
  uint uVar6;
  bool local_79;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 *local_60 [2];
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  int local_38;
  int iVar7;
  QList<QDockWidget_*> *widgets;
  QDataStream *stream_00;
  QDockAreaLayoutInfo *this_00;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = CONCAT13(in_CL,in_stack_ffffffffffffff64) & 0x1ffffff;
  widgets = (QList<QDockWidget_*> *)&DAT_aaaaaaaaaaaaaaaa;
  stream_00 = (QDataStream *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QDockAreaLayoutInfo *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QDockWidget_*>::QList
            ((QList<QDockWidget_*> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (QList<QDockWidget_*> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  iVar7 = -0x55555556;
  QDataStream::operator>>(in_RSI,(int *)&stack0xffffffffffffffcc);
  iVar5 = 0;
  do {
    if (iVar7 <= iVar5) {
      local_60[0] = &DAT_aaaaaaaaaaaaaaaa;
      QSize::QSize((QSize *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      ::operator>>(in_RSI,(QSize *)local_60);
      QPoint::QPoint((QPoint *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      QRect::QRect((QRect *)CONCAT44(uVar6,iVar5),
                   (QPoint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      *(undefined8 *)(in_RDI + 0x30) = local_70;
      *(undefined8 *)(in_RDI + 0x38) = local_68;
      SVar2 = QDataStream::status(in_RSI);
      bVar4 = SVar2 == Ok;
      if ((bool)bVar4) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
          QDataStream::operator>>(in_RSI,(int *)((long)&local_18 + (long)iVar5 * 4));
        }
        SVar2 = QDataStream::status(in_RSI);
        if (SVar2 == Ok) {
          for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
            *(undefined4 *)(in_RDI + (long)iVar5 * 4) =
                 *(undefined4 *)((long)&local_18 + (long)iVar5 * 4);
          }
        }
        if ((uVar6 & 0x1000000) == 0) {
          *(undefined1 *)(in_RDI + 0x204) = 0;
        }
      }
      local_79 = (bool)(bVar4 & 1);
LAB_00577124:
      QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x577131);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_79;
    }
    local_38 = -0x55555556;
    QDataStream::operator>>(in_RSI,&local_38);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    ::operator>>(in_RSI,(QSize *)&local_40);
    if ((uVar6 & 0x1000000) == 0) {
      QPoint::QPoint((QPoint *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      QRect::QRect((QRect *)CONCAT44(uVar6,iVar5),
                   (QPoint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      lVar3 = in_RDI + 0x40 + (long)local_38 * 0x70;
      *(undefined8 *)(lVar3 + 0x28) = local_50;
      *(undefined8 *)(lVar3 + 0x30) = local_48;
    }
    bVar1 = QDockAreaLayoutInfo::restoreState
                      (this_00,stream_00,widgets,SUB41((uint)iVar7 >> 0x18,0));
    if (!bVar1) {
      QDataStream::setStatus((Status)in_RSI);
      local_79 = false;
      goto LAB_00577124;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool QDockAreaLayout::restoreState(QDataStream &stream, const QList<QDockWidget*> &_dockwidgets, bool testing)
{
    QList<QDockWidget*> dockwidgets = _dockwidgets;

    int cnt;
    stream >> cnt;
    for (int i = 0; i < cnt; ++i) {
        int pos;
        stream >> pos;
        QSize size;
        stream >> size;
        if (!testing) {
            docks[pos].rect = QRect(QPoint(0, 0), size);
        }
        if (!docks[pos].restoreState(stream, dockwidgets, testing)) {
            stream.setStatus(QDataStream::ReadCorruptData);
            return false;
        }
    }

    QSize size;
    stream >> size;
    centralWidgetRect = QRect(QPoint(0, 0), size);

    bool ok = stream.status() == QDataStream::Ok;

    if (ok) {
        int cornerData[4];
        for (int i = 0; i < 4; ++i)
            stream >> cornerData[i];
        if (stream.status() == QDataStream::Ok) {
            for (int i = 0; i < 4; ++i)
                corners[i] = static_cast<Qt::DockWidgetArea>(cornerData[i]);
        }

        if (!testing)
            fallbackToSizeHints = false;
    }

    return ok;
}